

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xmlXPathCompOpEvalFirst(xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op,xmlNodePtr *first)

{
  int *piVar1;
  xmlXPathCompExprPtr pxVar2;
  xmlXPathStepOp *pxVar3;
  int iVar4;
  xmlXPathOp xVar5;
  int iVar6;
  xmlXPathOp xVar7;
  xmlXPathContextPtr pxVar8;
  xmlXPathObjectPtr obj;
  xmlNodeSetPtr pxVar9;
  xmlXPathObjectPtr pxVar10;
  long lVar11;
  xmlNodePtr local_38;
  
  if (ctxt->error != 0) {
    return 0;
  }
  pxVar8 = ctxt->context;
  if (pxVar8->opLimit != 0) {
    iVar4 = xmlXPathCheckOpLimit(ctxt,1);
    if (iVar4 < 0) {
      return 0;
    }
    pxVar8 = ctxt->context;
  }
  if (4999 < pxVar8->depth) {
    iVar4 = 0x1a;
LAB_001b9b33:
    xmlXPathErr(ctxt,iVar4);
    return 0;
  }
  pxVar8->depth = pxVar8->depth + 1;
  xVar5 = op->op;
  if (XPATH_OP_SORT < xVar5) {
switchD_001b9b66_caseD_1:
    xVar5 = xmlXPathCompOpEval(ctxt,op);
    goto switchD_001b9b66_caseD_0;
  }
  pxVar2 = ctxt->comp;
  switch(xVar5) {
  case XPATH_OP_END:
    goto switchD_001b9b66_caseD_0;
  default:
    goto switchD_001b9b66_caseD_1;
  case XPATH_OP_UNION:
    xVar5 = xmlXPathCompOpEvalFirst(ctxt,pxVar2->steps + op->ch1,first);
    if (ctxt->error != 0) {
      return 0;
    }
    pxVar10 = ctxt->value;
    if ((((pxVar10 != (xmlXPathObjectPtr)0x0) && (pxVar10->type == XPATH_NODESET)) &&
        (pxVar9 = pxVar10->nodesetval, pxVar9 != (xmlNodeSetPtr)0x0)) && (0 < pxVar9->nodeNr)) {
      if (pxVar9->nodeNr != 1) {
        xmlXPathNodeSetSort(pxVar9);
        pxVar9 = ctxt->value->nodesetval;
      }
      *first = *pxVar9->nodeTab;
    }
    iVar4 = xmlXPathCompOpEvalFirst(ctxt,pxVar2->steps + op->ch2,first);
    if (ctxt->error != 0) {
      return 0;
    }
    pxVar10 = xmlXPathValuePop(ctxt);
    obj = xmlXPathValuePop(ctxt);
    if (((obj == (xmlXPathObjectPtr)0x0) ||
        (pxVar10 == (xmlXPathObjectPtr)0x0 || obj->type != XPATH_NODESET)) ||
       (pxVar10->type != XPATH_NODESET)) {
      xmlXPathReleaseObject(ctxt->context,obj);
      xmlXPathReleaseObject(ctxt->context,pxVar10);
      iVar4 = 0xb;
      goto LAB_001b9b33;
    }
    if ((ctxt->context->opLimit == 0) ||
       (((obj->nodesetval == (xmlNodeSetPtr)0x0 ||
         (iVar6 = xmlXPathCheckOpLimit(ctxt,(long)obj->nodesetval->nodeNr), -1 < iVar6)) &&
        ((pxVar10->nodesetval == (xmlNodeSetPtr)0x0 ||
         (iVar6 = xmlXPathCheckOpLimit(ctxt,(long)pxVar10->nodesetval->nodeNr), -1 < iVar6)))))) {
      pxVar9 = pxVar10->nodesetval;
      if ((pxVar9 != (xmlNodeSetPtr)0x0) && (pxVar9->nodeNr != 0)) {
        pxVar9 = xmlXPathNodeSetMerge(obj->nodesetval,pxVar9);
        obj->nodesetval = pxVar9;
        if (pxVar9 == (xmlNodeSetPtr)0x0) {
          xmlXPathPErrMemory(ctxt);
        }
      }
      xmlXPathValuePush(ctxt,obj);
      xmlXPathReleaseObject(ctxt->context,pxVar10);
      xVar5 = iVar4 + xVar5;
    }
    else {
      xmlXPathReleaseObject(ctxt->context,obj);
      xmlXPathReleaseObject(ctxt->context,pxVar10);
    }
    goto switchD_001b9b66_caseD_0;
  case XPATH_OP_ROOT:
    xmlXPathRoot(ctxt);
    break;
  case XPATH_OP_NODE:
    xVar5 = XPATH_OP_END;
    if ((long)op->ch1 != -1) {
      xVar5 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch1);
    }
    if (ctxt->error != 0) {
      return 0;
    }
    if ((long)op->ch2 != -1) {
      iVar4 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch2);
      if (ctxt->error != 0) {
        return 0;
      }
      xVar5 = iVar4 + xVar5;
    }
    pxVar10 = xmlXPathCacheNewNodeSet(ctxt,ctxt->context->node);
LAB_001b9ec7:
    xmlXPathValuePush(ctxt,pxVar10);
    goto switchD_001b9b66_caseD_0;
  case XPATH_OP_COLLECT:
    if ((long)op->ch1 != -1) {
      iVar4 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch1);
      if (ctxt->error != 0) {
        return 0;
      }
      iVar6 = xmlXPathNodeCollectAndTest(ctxt,op,first,(xmlNodePtr *)0x0,0);
      xVar5 = iVar6 + iVar4;
      goto switchD_001b9b66_caseD_0;
    }
    break;
  case XPATH_OP_VALUE:
    pxVar10 = xmlXPathCacheObjectCopy(ctxt,(xmlXPathObjectPtr)op->value4);
    xmlXPathValuePush(ctxt,pxVar10);
    break;
  case XPATH_OP_FILTER:
    if (ctxt->error == 0) {
      iVar4 = op->ch1;
      xVar5 = XPATH_OP_END;
      if ((long)iVar4 != -1) {
        lVar11 = (long)op->ch2;
        if (((((lVar11 != -1) && (pxVar3 = pxVar2->steps, pxVar3[iVar4].op == XPATH_OP_SORT)) &&
             ((pxVar3[lVar11].op == XPATH_OP_SORT &&
              ((lVar11 = (long)pxVar3[lVar11].ch1, lVar11 != -1 &&
               (pxVar3[lVar11].op == XPATH_OP_FUNCTION)))))) &&
            (pxVar3[lVar11].value5 == (void *)0x0)) &&
           ((pxVar3[lVar11].value == 0 && ((xmlChar *)pxVar3[lVar11].value4 != (xmlChar *)0x0)))) {
          iVar6 = xmlStrEqual((xmlChar *)pxVar3[lVar11].value4,(xmlChar *)"last");
          iVar4 = op->ch1;
          if (iVar6 != 0) {
            local_38 = (xmlNodePtr)0x0;
            xVar7 = xmlXPathCompOpEvalLast(ctxt,pxVar2->steps + iVar4,&local_38);
            xVar5 = XPATH_OP_END;
            if ((((ctxt->error == 0) &&
                 (pxVar10 = ctxt->value, xVar5 = xVar7, pxVar10 != (xmlXPathObjectPtr)0x0)) &&
                (pxVar10->type == XPATH_NODESET)) &&
               (((pxVar9 = pxVar10->nodesetval, pxVar9 != (xmlNodeSetPtr)0x0 &&
                 (pxVar9->nodeTab != (xmlNodePtr *)0x0)) && (1 < pxVar9->nodeNr)))) {
              xmlXPathNodeSetKeepLast(pxVar9);
              *first = *ctxt->value->nodesetval->nodeTab;
            }
            goto switchD_001b9b66_caseD_0;
          }
          xVar5 = XPATH_OP_END;
          if (iVar4 == -1) goto LAB_001b9d6c;
        }
        xVar5 = xmlXPathCompOpEval(ctxt,pxVar2->steps + iVar4);
      }
LAB_001b9d6c:
      if (ctxt->error == 0) {
        if ((op->ch2 == -1) || (ctxt->value == (xmlXPathObjectPtr)0x0))
        goto switchD_001b9b66_caseD_0;
        if (ctxt->value->type == XPATH_NODESET) {
          pxVar10 = xmlXPathValuePop(ctxt);
          pxVar9 = pxVar10->nodesetval;
          if ((pxVar9 != (xmlNodeSetPtr)0x0) &&
             (xmlXPathNodeSetFilter(ctxt,pxVar9,op->ch2,1,1,1), 0 < pxVar9->nodeNr)) {
            *first = *pxVar9->nodeTab;
          }
          goto LAB_001b9ec7;
        }
        xmlXPathErr(ctxt,0xb);
      }
    }
    break;
  case XPATH_OP_SORT:
    xVar5 = XPATH_OP_END;
    if ((long)op->ch1 != -1) {
      xVar5 = xmlXPathCompOpEvalFirst(ctxt,pxVar2->steps + op->ch1,first);
    }
    if (ctxt->error != 0) {
      return 0;
    }
    pxVar10 = ctxt->value;
    if ((((pxVar10 != (xmlXPathObjectPtr)0x0) && (pxVar10->type == XPATH_NODESET)) &&
        (pxVar9 = pxVar10->nodesetval, pxVar9 != (xmlNodeSetPtr)0x0)) && (1 < pxVar9->nodeNr)) {
      xmlXPathNodeSetSort(pxVar9);
    }
    goto switchD_001b9b66_caseD_0;
  }
  xVar5 = XPATH_OP_END;
switchD_001b9b66_caseD_0:
  piVar1 = &ctxt->context->depth;
  *piVar1 = *piVar1 + -1;
  return xVar5;
}

Assistant:

static int
xmlXPathCompOpEvalFirst(xmlXPathParserContextPtr ctxt,
                        xmlXPathStepOpPtr op, xmlNodePtr * first)
{
    int total = 0, cur;
    xmlXPathCompExprPtr comp;
    xmlXPathObjectPtr arg1, arg2;

    CHECK_ERROR0;
    if (OP_LIMIT_EXCEEDED(ctxt, 1))
        return(0);
    if (ctxt->context->depth >= XPATH_MAX_RECURSION_DEPTH)
        XP_ERROR0(XPATH_RECURSION_LIMIT_EXCEEDED);
    ctxt->context->depth += 1;
    comp = ctxt->comp;
    switch (op->op) {
        case XPATH_OP_END:
            break;
        case XPATH_OP_UNION:
            total =
                xmlXPathCompOpEvalFirst(ctxt, &comp->steps[op->ch1],
                                        first);
	    CHECK_ERROR0;
            if ((ctxt->value != NULL)
                && (ctxt->value->type == XPATH_NODESET)
                && (ctxt->value->nodesetval != NULL)
                && (ctxt->value->nodesetval->nodeNr >= 1)) {
                /*
                 * limit tree traversing to first node in the result
                 */
		/*
		* OPTIMIZE TODO: This implicitly sorts
		*  the result, even if not needed. E.g. if the argument
		*  of the count() function, no sorting is needed.
		* OPTIMIZE TODO: How do we know if the node-list wasn't
		*  already sorted?
		*/
		if (ctxt->value->nodesetval->nodeNr > 1)
		    xmlXPathNodeSetSort(ctxt->value->nodesetval);
                *first = ctxt->value->nodesetval->nodeTab[0];
            }
            cur =
                xmlXPathCompOpEvalFirst(ctxt, &comp->steps[op->ch2],
                                        first);
	    CHECK_ERROR0;

            arg2 = xmlXPathValuePop(ctxt);
            arg1 = xmlXPathValuePop(ctxt);
            if ((arg1 == NULL) || (arg1->type != XPATH_NODESET) ||
                (arg2 == NULL) || (arg2->type != XPATH_NODESET)) {
	        xmlXPathReleaseObject(ctxt->context, arg1);
	        xmlXPathReleaseObject(ctxt->context, arg2);
                XP_ERROR0(XPATH_INVALID_TYPE);
            }
            if ((ctxt->context->opLimit != 0) &&
                (((arg1->nodesetval != NULL) &&
                  (xmlXPathCheckOpLimit(ctxt,
                                        arg1->nodesetval->nodeNr) < 0)) ||
                 ((arg2->nodesetval != NULL) &&
                  (xmlXPathCheckOpLimit(ctxt,
                                        arg2->nodesetval->nodeNr) < 0)))) {
	        xmlXPathReleaseObject(ctxt->context, arg1);
	        xmlXPathReleaseObject(ctxt->context, arg2);
                break;
            }

            if ((arg2->nodesetval != NULL) &&
                (arg2->nodesetval->nodeNr != 0)) {
                arg1->nodesetval = xmlXPathNodeSetMerge(arg1->nodesetval,
                                                        arg2->nodesetval);
                if (arg1->nodesetval == NULL)
                    xmlXPathPErrMemory(ctxt);
            }
            xmlXPathValuePush(ctxt, arg1);
	    xmlXPathReleaseObject(ctxt->context, arg2);
            total += cur;
            break;
        case XPATH_OP_ROOT:
            xmlXPathRoot(ctxt);
            break;
        case XPATH_OP_NODE:
            if (op->ch1 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            if (op->ch2 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt,
		ctxt->context->node));
            break;
        case XPATH_OP_COLLECT:{
                if (op->ch1 == -1)
                    break;

                total = xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
		CHECK_ERROR0;

                total += xmlXPathNodeCollectAndTest(ctxt, op, first, NULL, 0);
                break;
            }
        case XPATH_OP_VALUE:
            xmlXPathValuePush(ctxt, xmlXPathCacheObjectCopy(ctxt, op->value4));
            break;
        case XPATH_OP_SORT:
            if (op->ch1 != -1)
                total +=
                    xmlXPathCompOpEvalFirst(ctxt, &comp->steps[op->ch1],
                                            first);
	    CHECK_ERROR0;
            if ((ctxt->value != NULL)
                && (ctxt->value->type == XPATH_NODESET)
                && (ctxt->value->nodesetval != NULL)
		&& (ctxt->value->nodesetval->nodeNr > 1))
                xmlXPathNodeSetSort(ctxt->value->nodesetval);
            break;
#ifdef XP_OPTIMIZED_FILTER_FIRST
	case XPATH_OP_FILTER:
                total += xmlXPathCompOpEvalFilterFirst(ctxt, op, first);
            break;
#endif
        default:
            total += xmlXPathCompOpEval(ctxt, op);
            break;
    }

    ctxt->context->depth -= 1;
    return(total);
}